

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.hpp
# Opt level: O2

uchar * trial::protocol::json::detail::scan_narrow<unsigned_char>(uchar *marker,uchar *tail)

{
  uint uVar1;
  ushort uVar2;
  category cVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  lVar4 = (long)tail - (long)marker;
  while( true ) {
    if (lVar4 < 0x11) {
      while ((marker != tail &&
             (cVar3 = traits::to_category<unsigned_char>(*marker), cVar3 == narrow))) {
        marker = marker + 1;
      }
      return marker;
    }
    auVar6[0] = -((char)(*marker ^ 2) < '!');
    auVar6[1] = -((char)(marker[1] ^ 2) < '!');
    auVar6[2] = -((char)(marker[2] ^ 2) < '!');
    auVar6[3] = -((char)(marker[3] ^ 2) < '!');
    auVar6[4] = -((char)(marker[4] ^ 2) < '!');
    auVar6[5] = -((char)(marker[5] ^ 2) < '!');
    auVar6[6] = -((char)(marker[6] ^ 2) < '!');
    auVar6[7] = -((char)(marker[7] ^ 2) < '!');
    auVar6[8] = -((char)(marker[8] ^ 2) < '!');
    auVar6[9] = -((char)(marker[9] ^ 2) < '!');
    auVar6[10] = -((char)(marker[10] ^ 2) < '!');
    auVar6[0xb] = -((char)(marker[0xb] ^ 2) < '!');
    auVar6[0xc] = -((char)(marker[0xc] ^ 2) < '!');
    auVar6[0xd] = -((char)(marker[0xd] ^ 2) < '!');
    auVar6[0xe] = -((char)(marker[0xe] ^ 2) < '!');
    auVar6[0xf] = -((char)(marker[0xf] ^ 2) < '!');
    auVar5[0] = -(*marker == '\\');
    auVar5[1] = -(marker[1] == '\\');
    auVar5[2] = -(marker[2] == '\\');
    auVar5[3] = -(marker[3] == '\\');
    auVar5[4] = -(marker[4] == '\\');
    auVar5[5] = -(marker[5] == '\\');
    auVar5[6] = -(marker[6] == '\\');
    auVar5[7] = -(marker[7] == '\\');
    auVar5[8] = -(marker[8] == '\\');
    auVar5[9] = -(marker[9] == '\\');
    auVar5[10] = -(marker[10] == '\\');
    auVar5[0xb] = -(marker[0xb] == '\\');
    auVar5[0xc] = -(marker[0xc] == '\\');
    auVar5[0xd] = -(marker[0xd] == '\\');
    auVar5[0xe] = -(marker[0xe] == '\\');
    auVar5[0xf] = -(marker[0xf] == '\\');
    auVar5 = auVar5 | auVar6;
    uVar2 = (ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar5[0xf] >> 7) << 0xf;
    if (uVar2 != 0) break;
    marker = marker + 0x10;
    lVar4 = lVar4 + -0x10;
  }
  uVar1 = 0;
  if (uVar2 != 0) {
    for (; (uVar2 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
    }
  }
  return marker + uVar1;
}

Assistant:

auto scan_narrow(const CharT *marker,
                 const CharT * const tail) noexcept -> const CharT *
{
#if defined(TRIAL_PROTOCOL_USE_SSE2)
    // Swaps space and quote characters
    const auto permuter = _mm_set1_epi8(0x02);
    // Covers permuted quote and control characters + extra characters
    const auto lower = _mm_set1_epi8(0x21);
    const auto escape = _mm_set1_epi8(0x5e);
    while (tail - marker > 16)
    {
        const auto data = _mm_xor_si128(_mm_loadu_si128((const __m128i *)marker),
                                        permuter);
        const auto avoid = _mm_or_si128(_mm_cmpeq_epi8(data, escape),
                                        _mm_cmplt_epi8(data, lower));
        const auto mask = _mm_movemask_epi8(avoid);
        if (mask != 0)
            return marker + core::detail::countr_zero(mask);
        marker += 16;
    }
#endif

    while (marker != tail)
    {
        if (traits::to_category(*marker) == traits::category::narrow)
        {
            ++marker;
        }
        else
            break;
    }
    return marker;
}